

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_utility.h
# Opt level: O2

vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *
testinator::Arbitrary<std::tuple<int>_>::shrink
          (vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *__return_storage_ptr__,
          tuple<int> *t)

{
  vector<std::tuple<>,_std::allocator<std::tuple<>_>_> tail_v;
  vector<int,_std::allocator<int>_> head_v;
  _Vector_base<std::tuple<>,_std::allocator<std::tuple<>_>_> local_48;
  _Vector_base<int,_std::allocator<int>_> local_28;
  
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<std::tuple<>,_std::allocator<std::tuple<>_>_>::~_Vector_base(&local_48);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_28);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::tuple<Ts...>> shrink(const std::tuple<Ts...>& t)
    {
      std::vector<std::tuple<Ts...>> ret{};

      // shrink the head
      using H = std::decay_t<decltype(std::get<0>(t))>;
      auto head_v = Arbitrary<H>::shrink(std::get<0>(t));
      for (auto& e : head_v)
      {
        ret.push_back(tuple_cons(std::move(e), tuple_tail(t)));
      }

      // shrink the tail recursively
      using T = std::decay_t<decltype(tuple_tail(t))>;
      auto tail_v = Arbitrary<T>::shrink(tuple_tail(t));
      for (auto& e : tail_v)
      {
        ret.push_back(tuple_cons(std::get<0>(t), std::move(e)));
      }

      return ret;
    }